

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS
ref_phys_ddes_blend(REF_DBL mach,REF_DBL reynolds_number,REF_DBL sqrt_vel_grad_dot_grad,
                   REF_DBL distance,REF_DBL nu,REF_DBL *fd)

{
  double dVar1;
  double dVar2;
  undefined8 local_70;
  undefined8 local_60;
  REF_DBL denom;
  REF_DBL num;
  REF_DBL kappa;
  REF_DBL rd;
  REF_DBL *fd_local;
  REF_DBL nu_local;
  REF_DBL distance_local;
  REF_DBL sqrt_vel_grad_dot_grad_local;
  REF_DBL reynolds_number_local;
  REF_DBL mach_local;
  
  dVar1 = (mach * nu) / reynolds_number;
  dVar2 = sqrt_vel_grad_dot_grad * 0.41 * 0.41 * distance * distance;
  if (dVar2 * 1e+20 <= 0.0) {
    local_60 = -(dVar2 * 1e+20);
  }
  else {
    local_60 = dVar2 * 1e+20;
  }
  local_70 = dVar1;
  if (dVar1 <= 0.0) {
    local_70 = -dVar1;
  }
  if (local_60 <= local_70) {
    *fd = 0.0;
  }
  else {
    dVar1 = pow((dVar1 / dVar2) * 8.0,3.0);
    dVar1 = tanh(dVar1);
    *fd = 1.0 - dVar1;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_phys_ddes_blend(REF_DBL mach, REF_DBL reynolds_number,
                                       REF_DBL sqrt_vel_grad_dot_grad,
                                       REF_DBL distance, REF_DBL nu,
                                       REF_DBL *fd) {
  REF_DBL rd;
  REF_DBL kappa = 0.41;
  REF_DBL num, denom;
  num = mach * nu / reynolds_number;
  denom = sqrt_vel_grad_dot_grad * kappa * kappa * distance * distance;
  if (ref_math_divisible(num, denom)) {
    rd = num / denom;
    *fd = 1.0 - tanh(pow(8.0 * rd, 3));
  } else {
    *fd = 0.0;
  };
  return REF_SUCCESS;
}